

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource.cc
# Opt level: O2

string * __thiscall
InputSource::read_line_abi_cxx11_
          (string *__return_storage_ptr__,InputSource *this,size_t count,qpdf_offset_t at)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)count);
  read_line(this,__return_storage_ptr__,count,at);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
InputSource::read_line(size_t count, qpdf_offset_t at)
{
    std::string result(count, '\0');
    read_line(result, count, at);
    return result;
}